

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter2.cpp
# Opt level: O0

void __thiscall ApplicationContext::~ApplicationContext(ApplicationContext *this)

{
  pointer pJVar1;
  vector<JournalEntry,_std::allocator<JournalEntry>_> *in_RDI;
  CSP *in_stack_ffffffffffffffe0;
  ApplicationContextBase *this_00;
  
  (in_RDI->super__Vector_base<JournalEntry,_std::allocator<JournalEntry>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__ApplicationContext_00252838;
  *(undefined1 *)
   &in_RDI[1].super__Vector_base<JournalEntry,_std::allocator<JournalEntry>_>._M_impl.
    super__Vector_impl_data._M_start = 1;
  std::thread::join();
  pJVar1 = in_RDI[4].super__Vector_base<JournalEntry,_std::allocator<JournalEntry>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  if (pJVar1 != (pointer)0x0) {
    CSP::~CSP(in_stack_ffffffffffffffe0);
    operator_delete(pJVar1,0x2f0);
  }
  this_00 = (ApplicationContextBase *)
            in_RDI[5].super__Vector_base<JournalEntry,_std::allocator<JournalEntry>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (this_00 != (ApplicationContextBase *)0x0) {
    Blackboard::~Blackboard((Blackboard *)0x12b7b7);
    operator_delete(this_00,0x60);
  }
  std::vector<JournalEntry,_std::allocator<JournalEntry>_>::~vector(in_RDI);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_RDI);
  std::thread::~thread((thread *)0x12b7f3);
  RenderContext::~RenderContext
            ((RenderContext *)
             &in_RDI[2].super__Vector_base<JournalEntry,_std::allocator<JournalEntry>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  StateContext::~StateContext
            ((StateContext *)
             &in_RDI[2].super__Vector_base<JournalEntry,_std::allocator<JournalEntry>_>._M_impl.
              super__Vector_impl_data._M_finish);
  ApplicationContextBase::~ApplicationContextBase(this_00);
  return;
}

Assistant:

~ApplicationContext()
    {
        ///>
        /// join_now is most likely true from having been set by a Quit
        /// event, but just to be sure, set it here.
        ///<C++
        join_now = true;

        ///>
        /// Allow the clock thread to join gracefully
        ///<C++
        clock.join();

        delete csp;
        delete blackboard;
    }